

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::ConsoleLogger(ConsoleLogger *this,ostream *out,bool colored)

{
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [19];
  allocator local_1a;
  byte local_19;
  ostream *poStack_18;
  bool colored_local;
  ostream *out_local;
  ConsoleLogger *this_local;
  
  this->out = out;
  local_19 = colored;
  poStack_18 = out;
  out_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->infoColor,"\x1b[0;32m",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->warnColor,"\x1b[1;33m",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->errorColor,"\x1b[1;31m",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->debugColor,"\x1b[1;30m",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  this->colored = (bool)(local_19 & 1);
  this->loglevel = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::unordered_map(&this->starttimes);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>
  ::unordered_map(&this->counts);
  std::mutex::mutex(&this->mtx);
  return;
}

Assistant:

inline ConsoleLogger::ConsoleLogger(std::ostream& out, bool colored):
	out(out), colored(colored)
{
}